

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

uint av1_refine_warped_mv
               (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
               BLOCK_SIZE bsize,int *pts0,int *pts_inref0,int total_samples,
               WARP_SEARCH_METHOD search_method,int num_iterations)

{
  short sVar1;
  uint8_t uVar2;
  int iVar3;
  byte bVar4;
  int mvx;
  int *in_RDX;
  undefined4 *in_RDI;
  void *in_R8;
  void *in_R9;
  int in_stack_00000008;
  byte in_stack_00000010;
  int in_stack_00000018;
  MV this_mv;
  uint thismse;
  int idx;
  int best_idx;
  int ite;
  uint8_t valid_neighbors;
  int mi_col;
  int mi_row;
  int pts_inref [16];
  int pts [16];
  int mv_shift;
  SubpelMvLimits *mv_limits;
  uint bestmse;
  int best_num_proj_ref;
  WarpedMotionParams best_wm_params;
  MV *best_mv;
  uint8_t *neighbor_mask;
  int num_neighbors;
  MV *neighbors;
  MB_MODE_INFO *mbmi;
  MV mv;
  uint in_stack_fffffffffffffecc;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined4 in_stack_fffffffffffffedc;
  uint uVar8;
  int np;
  undefined4 uVar9;
  undefined1 local_118 [8];
  WarpedMotionParams *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  BLOCK_SIZE in_stack_ffffffffffffff0f;
  SUBPEL_MOTION_SEARCH_PARAMS *in_stack_ffffffffffffff10;
  AV1_COMMON *in_stack_ffffffffffffff18;
  MACROBLOCKD *in_stack_ffffffffffffff20;
  undefined1 local_d8 [68];
  uint local_94;
  SubpelMvLimits *local_90;
  uint local_84;
  uint local_80;
  undefined1 local_7c [36];
  short *local_58;
  long local_50;
  int local_44;
  long local_40;
  long local_38;
  void *local_30;
  void *local_28;
  int *local_18;
  undefined4 *local_8;
  
  local_38 = **(long **)(in_RDI + 0x7ae);
  local_40 = (ulong)in_stack_00000010 * 0x2c + 0xba0ee4;
  local_44 = warp_search_info[in_stack_00000010].num_neighbors;
  local_50 = (ulong)in_stack_00000010 * 0x2c + 0xba0f04;
  local_58 = (short *)(local_38 + 8);
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_RDI;
  memcpy(local_7c,(void *)(local_38 + 0x1c),0x24);
  local_80 = (uint)*(byte *)(local_38 + 0x19);
  local_90 = (SubpelMvLimits *)(local_18 + 6);
  local_94 = (uint)(*local_18 == 0);
  local_84 = compute_motion_cost(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f,
                                 (MV *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                                );
  uVar9 = *local_8;
  np = local_8[1];
  uVar8 = CONCAT13(0xff,(int3)in_stack_fffffffffffffedc);
  for (iVar7 = 0; iVar7 < in_stack_00000018; iVar7 = iVar7 + 1) {
    iVar6 = -1;
    for (iVar5 = 0; bVar4 = (byte)local_94, iVar5 < local_44; iVar5 = iVar5 + 1) {
      if ((uVar8 >> 0x18 & 1 << ((byte)iVar5 & 0x1f)) != 0) {
        sVar1 = *(short *)(local_40 + 2 + (long)iVar5 * 4);
        mvx = (int)sVar1;
        mv.col = local_58[1] + sVar1 * (short)(1 << (bVar4 & 0x1f));
        mv.row = *local_58 + *(short *)(local_40 + (long)iVar5 * 4) * (short)(1 << (bVar4 & 0x1f));
        iVar3 = av1_is_subpelmv_in_range(local_90,mv);
        if (iVar3 != 0) {
          memcpy(local_d8,local_28,(long)(in_stack_00000008 << 1) << 2);
          memcpy(local_118,local_30,(long)(in_stack_00000008 << 1) << 2);
          if (1 < in_stack_00000008) {
            uVar2 = av1_selectSamples((MV *)CONCAT44(uVar9,np),(int *)CONCAT44(uVar8,iVar7),
                                      (int *)CONCAT44(iVar6,iVar5),in_stack_fffffffffffffecc,
                                      mv.col._1_1_);
            *(uint8_t *)(local_38 + 0x19) = uVar2;
          }
          iVar3 = av1_find_projection(np,(int *)CONCAT44(uVar8,iVar7),(int *)CONCAT44(iVar6,iVar5),
                                      (BLOCK_SIZE)(in_stack_fffffffffffffecc >> 0x18),(int)mv,mvx,
                                      in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
                                      in_stack_ffffffffffffff00);
          if ((iVar3 == 0) &&
             (in_stack_fffffffffffffecc =
                   compute_motion_cost(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                                       in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f,
                                       (MV *)CONCAT44(in_stack_ffffffffffffff04,
                                                      in_stack_ffffffffffffff00)),
             in_stack_fffffffffffffecc < local_84)) {
            iVar6 = iVar5;
            memcpy(local_7c,(void *)(local_38 + 0x1c),0x24);
            local_80 = (uint)*(byte *)(local_38 + 0x19);
            local_84 = in_stack_fffffffffffffecc;
          }
        }
      }
    }
    if (iVar6 == -1) break;
    if (-1 < iVar6) {
      *local_58 = *local_58 + *(short *)(local_40 + (long)iVar6 * 4) * (short)(1 << (bVar4 & 0x1f));
      local_58[1] = local_58[1] +
                    *(short *)(local_40 + 2 + (long)iVar6 * 4) * (short)(1 << (bVar4 & 0x1f));
      uVar8 = CONCAT13(*(undefined1 *)(local_50 + iVar6),(int3)uVar8);
    }
  }
  memcpy((void *)(local_38 + 0x1c),local_7c,0x24);
  *(char *)(local_38 + 0x19) = (char)local_80;
  return local_84;
}

Assistant:

unsigned int av1_refine_warped_mv(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                  const SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                  BLOCK_SIZE bsize, const int *pts0,
                                  const int *pts_inref0, int total_samples,
                                  WARP_SEARCH_METHOD search_method,
                                  int num_iterations) {
  MB_MODE_INFO *mbmi = xd->mi[0];

  const MV *neighbors = warp_search_info[search_method].neighbors;
  const int num_neighbors = warp_search_info[search_method].num_neighbors;
  const uint8_t *neighbor_mask = warp_search_info[search_method].neighbor_mask;

  MV *best_mv = &mbmi->mv[0].as_mv;

  WarpedMotionParams best_wm_params = mbmi->wm_params;
  int best_num_proj_ref = mbmi->num_proj_ref;
  unsigned int bestmse;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  const int mv_shift = ms_params->allow_hp ? 0 : 1;

  // Calculate the center position's error
  assert(av1_is_subpelmv_in_range(mv_limits, *best_mv));
  bestmse = compute_motion_cost(xd, cm, ms_params, bsize, best_mv);

  // MV search
  int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // First step always scans all neighbors
  uint8_t valid_neighbors = UINT8_MAX;

  for (int ite = 0; ite < num_iterations; ++ite) {
    int best_idx = -1;

    for (int idx = 0; idx < num_neighbors; ++idx) {
      if ((valid_neighbors & (1 << idx)) == 0) {
        continue;
      }

      unsigned int thismse;

      MV this_mv = { best_mv->row + neighbors[idx].row * (1 << mv_shift),
                     best_mv->col + neighbors[idx].col * (1 << mv_shift) };
      if (av1_is_subpelmv_in_range(mv_limits, this_mv)) {
        memcpy(pts, pts0, total_samples * 2 * sizeof(*pts0));
        memcpy(pts_inref, pts_inref0, total_samples * 2 * sizeof(*pts_inref0));
        if (total_samples > 1) {
          mbmi->num_proj_ref =
              av1_selectSamples(&this_mv, pts, pts_inref, total_samples, bsize);
        }

        if (!av1_find_projection(mbmi->num_proj_ref, pts, pts_inref, bsize,
                                 this_mv.row, this_mv.col, &mbmi->wm_params,
                                 mi_row, mi_col)) {
          thismse = compute_motion_cost(xd, cm, ms_params, bsize, &this_mv);

          if (thismse < bestmse) {
            best_idx = idx;
            best_wm_params = mbmi->wm_params;
            best_num_proj_ref = mbmi->num_proj_ref;
            bestmse = thismse;
          }
        }
      }
    }

    if (best_idx == -1) break;

    if (best_idx >= 0) {
      best_mv->row += neighbors[best_idx].row * (1 << mv_shift);
      best_mv->col += neighbors[best_idx].col * (1 << mv_shift);
      valid_neighbors = neighbor_mask[best_idx];
    }
  }

  mbmi->wm_params = best_wm_params;
  mbmi->num_proj_ref = best_num_proj_ref;
  return bestmse;
}